

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscachebackend.cpp
# Opt level: O0

bool __thiscall QNetworkAccessCacheBackend::sendCacheContents(QNetworkAccessCacheBackend *this)

{
  QByteArrayView s;
  QLatin1StringView s_00;
  QByteArrayView defaultValue;
  bool bVar1;
  Operation OVar2;
  QLatin1String *this_00;
  undefined8 uVar3;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QAbstractNetworkCache *nc;
  QLatin1StringView cacheControlValue;
  QHttpHeaders headers;
  AttributesMap attributes;
  QNetworkCacheMetaData item;
  QVariant redirectionTarget;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  QLatin1String *in_stack_fffffffffffffed0;
  QLatin1String *this_01;
  undefined4 uVar5;
  WellKnownHeader name;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 uVar6;
  Attribute in_stack_fffffffffffffeec;
  Attribute attribute;
  qsizetype in_stack_ffffffffffffff00;
  storage_type *in_stack_ffffffffffffff08;
  bool local_c9;
  QUrl local_c8;
  QUrl local_c0;
  undefined4 local_b4;
  QByteArrayView local_b0;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 local_80;
  QUrl local_78;
  undefined8 local_70;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (undefined4)in_RDI;
  name = (WellKnownHeader)((ulong)in_RDI >> 0x20);
  QNetworkAccessBackend::setCachingEnabled
            ((QNetworkAccessBackend *)in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf);
  this_00 = (QLatin1String *)QNetworkAccessBackend::networkCache((QNetworkAccessBackend *)0x19729c);
  if (this_00 == (QLatin1String *)0x0) {
    local_c9 = false;
    goto LAB_0019768f;
  }
  local_70 = 0xaaaaaaaaaaaaaaaa;
  this_01 = this_00;
  QNetworkAccessBackend::url((QNetworkAccessBackend *)this_00);
  (**(code **)((((Private *)&this_01->m_size)->data).shared + 0x60))(&local_70,this_01,&local_78);
  QUrl::~QUrl(&local_78);
  bVar1 = QNetworkCacheMetaData::isValid((QNetworkCacheMetaData *)in_stack_fffffffffffffed0);
  if (bVar1) {
    local_80 = 0xaaaaaaaaaaaaaaaa;
    QNetworkCacheMetaData::attributes((QNetworkCacheMetaData *)this_01);
    local_84 = 0;
    QHash<QNetworkRequest::Attribute,_QVariant>::value
              ((QHash<QNetworkRequest::Attribute,_QVariant> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (Attribute *)CONCAT44(name,uVar5));
    QNetworkAccessBackend::setAttribute
              ((QNetworkAccessBackend *)CONCAT44(name,uVar5),in_stack_fffffffffffffeec,
               (QVariant *)this_01);
    QVariant::~QVariant(&local_28);
    local_88 = 1;
    QHash<QNetworkRequest::Attribute,_QVariant>::value
              ((QHash<QNetworkRequest::Attribute,_QVariant> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (Attribute *)CONCAT44(name,uVar5));
    QNetworkAccessBackend::setAttribute
              ((QNetworkAccessBackend *)CONCAT44(name,uVar5),in_stack_fffffffffffffeec,
               (QVariant *)this_01);
    QVariant::~QVariant(&local_48);
    local_90 = 0xaaaaaaaaaaaaaaaa;
    QNetworkCacheMetaData::headers((QNetworkCacheMetaData *)this_01);
    local_a0 = 0xaaaaaaaaaaaaaaaa;
    local_98 = 0xaaaaaaaaaaaaaaaa;
    QByteArrayView::QByteArrayView(&local_b0);
    defaultValue.m_data = in_stack_ffffffffffffff08;
    defaultValue.m_size = in_stack_ffffffffffffff00;
    QHttpHeaders::value((QHttpHeaders *)
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),name,
                        defaultValue);
    s.m_size._4_4_ = name;
    s.m_size._0_4_ = uVar5;
    s.m_data._0_4_ = in_stack_fffffffffffffee8;
    s.m_data._4_4_ = in_stack_fffffffffffffeec;
    QLatin1String::QLatin1String(this_01,s);
    Qt::Literals::StringLiterals::operator____L1((char *)this_01,(size_t)in_stack_fffffffffffffed0);
    QVar4.m_size._4_4_ = name;
    QVar4.m_size._0_4_ = uVar5;
    QVar4.m_data._0_4_ = in_stack_fffffffffffffee8;
    QVar4.m_data._4_4_ = in_stack_fffffffffffffeec;
    bVar1 = QLatin1String::contains
                      ((QLatin1String *)
                       CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),QVar4,
                       CaseInsensitive);
    if (bVar1) {
LAB_001974e6:
      local_c9 = false;
    }
    else {
      QVar4 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)this_01,(size_t)in_stack_fffffffffffffed0);
      uVar6 = (undefined4)QVar4.m_size;
      attribute = QVar4.m_size._4_4_;
      s_00.m_size._4_4_ = name;
      s_00.m_size._0_4_ = uVar5;
      s_00.m_data._0_4_ = uVar6;
      s_00.m_data._4_4_ = attribute;
      bVar1 = QLatin1String::contains
                        ((QLatin1String *)
                         CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),s_00,
                         CaseInsensitive);
      if (bVar1) goto LAB_001974e6;
      QNetworkAccessBackend::setHeaders
                ((QNetworkAccessBackend *)in_stack_fffffffffffffed0,
                 (QHttpHeaders *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      local_68.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
      local_68._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_68._16_8_ = 0xaaaaaaaaaaaaaaaa;
      local_50 = 0xaaaaaaaaaaaaaaaa;
      local_b4 = 2;
      QHash<QNetworkRequest::Attribute,_QVariant>::value
                ((QHash<QNetworkRequest::Attribute,_QVariant> *)CONCAT44(attribute,uVar6),
                 (Attribute *)CONCAT44(name,uVar5));
      bVar1 = QVariant::isValid((QVariant *)in_stack_fffffffffffffed0);
      if (bVar1) {
        QNetworkAccessBackend::setAttribute
                  ((QNetworkAccessBackend *)CONCAT44(name,uVar5),attribute,(QVariant *)this_01);
        QVariant::toUrl();
        QNetworkAccessBackend::redirectionRequested
                  ((QNetworkAccessBackend *)in_stack_fffffffffffffed0,
                   (QUrl *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        QUrl::~QUrl(&local_c0);
      }
      QNetworkAccessBackend::metaDataChanged((QNetworkAccessBackend *)0x1975cd);
      OVar2 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)0x1975d7);
      if (OVar2 == GetOperation) {
        QNetworkAccessBackend::url((QNetworkAccessBackend *)this_01);
        uVar3 = (**(code **)((((Private *)&this_00->m_size)->data).shared + 0x70))
                          (this_00,&local_c8);
        *(undefined8 *)(CONCAT44(name,uVar5) + 0x10) = uVar3;
        QUrl::~QUrl(&local_c8);
        if (*(long *)(CONCAT44(name,uVar5) + 0x10) != 0) {
          QObject::setParent(*(QObject **)(CONCAT44(name,uVar5) + 0x10));
          QNetworkAccessBackend::readyRead((QNetworkAccessBackend *)0x19764e);
          in_stack_fffffffffffffed0 = this_00;
          goto LAB_0019764e;
        }
        local_c9 = false;
        in_stack_fffffffffffffed0 = this_00;
      }
      else {
LAB_0019764e:
        local_c9 = true;
      }
      QVariant::~QVariant((QVariant *)&local_68);
    }
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x197675);
    QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
              ((QHash<QNetworkRequest::Attribute,_QVariant> *)in_stack_fffffffffffffed0);
  }
  else {
    local_c9 = false;
  }
  QNetworkCacheMetaData::~QNetworkCacheMetaData((QNetworkCacheMetaData *)0x19768f);
LAB_0019768f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_c9;
}

Assistant:

bool QNetworkAccessCacheBackend::sendCacheContents()
{
    setCachingEnabled(false);
    QAbstractNetworkCache *nc = networkCache();
    if (!nc)
        return false;

    QNetworkCacheMetaData item = nc->metaData(url());
    if (!item.isValid())
        return false;

    QNetworkCacheMetaData::AttributesMap attributes = item.attributes();
    setAttribute(QNetworkRequest::HttpStatusCodeAttribute,
                 attributes.value(QNetworkRequest::HttpStatusCodeAttribute));
    setAttribute(QNetworkRequest::HttpReasonPhraseAttribute,
                 attributes.value(QNetworkRequest::HttpReasonPhraseAttribute));

    // set the headers
    auto headers = item.headers();
    const auto cacheControlValue = QLatin1StringView(
            headers.value(QHttpHeaders::WellKnownHeader::CacheControl));
    // RFC 9111 Section 5.2 Cache Control
    if (cacheControlValue.contains("must-revalidate"_L1, Qt::CaseInsensitive)
        || cacheControlValue.contains("no-cache"_L1, Qt::CaseInsensitive)) {
        return false;
    }
    setHeaders(std::move(headers));

    // handle a possible redirect
    QVariant redirectionTarget = attributes.value(QNetworkRequest::RedirectionTargetAttribute);
    if (redirectionTarget.isValid()) {
        setAttribute(QNetworkRequest::RedirectionTargetAttribute, redirectionTarget);
        redirectionRequested(redirectionTarget.toUrl());
    }

    // signal we're open
    metaDataChanged();

    if (operation() == QNetworkAccessManager::GetOperation) {
        device = nc->data(url());
        if (!device)
            return false;
        device->setParent(this);
        readyRead();
    }

#if defined(QNETWORKACCESSCACHEBACKEND_DEBUG)
    qDebug() << "Successfully sent cache:" << url();
#endif
    return true;
}